

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# token.cc
# Opt level: O2

void __thiscall wabt::Token::Token(Token *this,Location loc,TokenType token_type,string *text)

{
  (this->loc).field_1.field_1.offset = (size_t)loc.field_1.field_1.offset;
  *(undefined8 *)((long)&(this->loc).field_1 + 8) = loc.field_1._8_8_;
  (this->loc).filename.data_ = loc.filename.data_;
  (this->loc).filename.size_ = loc.filename.size_;
  this->token_type_ = token_type;
  if (token_type - AlignEqNat < 5) {
    std::__cxx11::string::string((string *)&(this->field_2).text_,(string *)text);
    return;
  }
  __assert_fail("HasText()",
                "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/wabt/src/token.cc"
                ,0x39,"wabt::Token::Token(Location, TokenType, const std::string &)");
}

Assistant:

Token::Token(Location loc, TokenType token_type, const std::string& text)
    : loc(loc), token_type_(token_type) {
  assert(HasText());
  Construct(text_, text);
}